

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.h
# Opt level: O0

uchar __thiscall chatra::Reader::readRawInteger<unsigned_char>(Reader *this)

{
  byte bVar1;
  size_type sVar2;
  byte *pbVar3;
  IllegalArgumentException *this_00;
  byte local_40;
  uint64_t c;
  ulong uStack_20;
  uint position;
  uint64_t t;
  Reader *this_local;
  
  checkSpace(this,1);
  sVar2 = this->offset;
  this->offset = sVar2 + 1;
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(this->buffer,sVar2);
  this_local._7_1_ = *pbVar3;
  if (0x7f < (ulong)this_local._7_1_) {
    uStack_20 = (ulong)this_local._7_1_ & 0x7f;
    c._4_4_ = 7;
    while( true ) {
      if (0x3f < c._4_4_) {
        this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
        memset(this_00,0,0x28);
        IllegalArgumentException::IllegalArgumentException(this_00);
        __cxa_throw(this_00,&IllegalArgumentException::typeinfo,
                    IllegalArgumentException::~IllegalArgumentException);
      }
      checkSpace(this,1);
      sVar2 = this->offset;
      this->offset = sVar2 + 1;
      pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(this->buffer,sVar2);
      bVar1 = *pbVar3;
      if ((bVar1 & 0x80) == 0) break;
      uStack_20 = ((ulong)bVar1 & 0x7f) << ((byte)c._4_4_ & 0x3f) | uStack_20;
      c._4_4_ = c._4_4_ + 7;
    }
    local_40 = (byte)(((ulong)bVar1 & 0x3f) << ((byte)c._4_4_ & 0x3f)) | (byte)uStack_20;
    if ((bVar1 & 0x40) != 0) {
      local_40 = local_40 ^ 0xff;
    }
    this_local._7_1_ = local_40;
  }
  return this_local._7_1_;
}

Assistant:

Type readRawInteger() {
		checkSpace();
		auto t = static_cast<uint64_t>(buffer->at(offset++));
		if (t < 128)
			return static_cast<Type>(t);
		t &= 0x7FU;
		for (unsigned position = 7; position < 64; position += 7) {
			checkSpace();
			auto c = static_cast<uint64_t>(buffer->at(offset++));
			if (c & 0x80U)
				t |= (c & 0x7FU) << position;
			else {
				t |= (c & 0x3FU) << position;
				return static_cast<Type>(c & 0x40U ? ~t : t);
			}
		}
		throw IllegalArgumentException();
	}